

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

scalar_function_t *
duckdb::GetScalarIntegerFunction<duckdb::SubtractOperator>
          (scalar_function_t *__return_storage_ptr__,PhysicalType type)

{
  int iVar1;
  NotImplementedException *this;
  PhysicalType type_00;
  undefined7 in_register_00000031;
  allocator local_61;
  string local_60;
  string local_40;
  
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 2:
    local_60._M_dataplus._M_p =
         (pointer)ScalarFunction::
                  BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::SubtractOperator>
    ;
    break;
  case 3:
    local_60._M_dataplus._M_p =
         (pointer)ScalarFunction::
                  BinaryFunction<signed_char,signed_char,signed_char,duckdb::SubtractOperator>;
    break;
  case 4:
    local_60._M_dataplus._M_p =
         (pointer)ScalarFunction::
                  BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::SubtractOperator>
    ;
    break;
  case 5:
    local_60._M_dataplus._M_p =
         (pointer)ScalarFunction::BinaryFunction<short,short,short,duckdb::SubtractOperator>;
    break;
  case 6:
    local_60._M_dataplus._M_p =
         (pointer)ScalarFunction::
                  BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::SubtractOperator>;
    break;
  case 7:
    local_60._M_dataplus._M_p =
         (pointer)ScalarFunction::BinaryFunction<int,int,int,duckdb::SubtractOperator>;
    break;
  case 8:
    local_60._M_dataplus._M_p =
         (pointer)ScalarFunction::
                  BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::SubtractOperator>
    ;
    break;
  case 9:
    local_60._M_dataplus._M_p =
         (pointer)ScalarFunction::BinaryFunction<long,long,long,duckdb::SubtractOperator>;
    break;
  default:
    if (iVar1 == 0xcb) {
      local_60._M_dataplus._M_p =
           (pointer)ScalarFunction::
                    BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::SubtractOperator>
      ;
    }
    else {
      if (iVar1 != 0xcc) {
        this = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_60,"Unimplemented type for GetScalarBinaryFunction: %s",
                   &local_61);
        TypeIdToString_abi_cxx11_(&local_40,(duckdb *)(ulong)type,type_00);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this,&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
        __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_60._M_dataplus._M_p =
           (pointer)ScalarFunction::
                    BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::SubtractOperator>
      ;
    }
  }
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             __return_storage_ptr__,
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)&local_60);
  return __return_storage_ptr__;
}

Assistant:

static scalar_function_t GetScalarIntegerFunction(PhysicalType type) {
	scalar_function_t function;
	switch (type) {
	case PhysicalType::INT8:
		function = &ScalarFunction::BinaryFunction<int8_t, int8_t, int8_t, OP>;
		break;
	case PhysicalType::INT16:
		function = &ScalarFunction::BinaryFunction<int16_t, int16_t, int16_t, OP>;
		break;
	case PhysicalType::INT32:
		function = &ScalarFunction::BinaryFunction<int32_t, int32_t, int32_t, OP>;
		break;
	case PhysicalType::INT64:
		function = &ScalarFunction::BinaryFunction<int64_t, int64_t, int64_t, OP>;
		break;
	case PhysicalType::INT128:
		function = &ScalarFunction::BinaryFunction<hugeint_t, hugeint_t, hugeint_t, OP>;
		break;
	case PhysicalType::UINT8:
		function = &ScalarFunction::BinaryFunction<uint8_t, uint8_t, uint8_t, OP>;
		break;
	case PhysicalType::UINT16:
		function = &ScalarFunction::BinaryFunction<uint16_t, uint16_t, uint16_t, OP>;
		break;
	case PhysicalType::UINT32:
		function = &ScalarFunction::BinaryFunction<uint32_t, uint32_t, uint32_t, OP>;
		break;
	case PhysicalType::UINT64:
		function = &ScalarFunction::BinaryFunction<uint64_t, uint64_t, uint64_t, OP>;
		break;
	case PhysicalType::UINT128:
		function = &ScalarFunction::BinaryFunction<uhugeint_t, uhugeint_t, uhugeint_t, OP>;
		break;
	default:
		throw NotImplementedException("Unimplemented type for GetScalarBinaryFunction: %s", TypeIdToString(type));
	}
	return function;
}